

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-netcdf-cursor.c
# Opt level: O3

int coda_netcdf_cursor_set_product(coda_cursor_conflict *cursor,coda_product *product)

{
  cursor->product = product;
  cursor->n = 1;
  cursor->stack[0].type = product->root_type;
  *(undefined4 *)&cursor->stack[0].index = 0xffffffff;
  *(undefined4 *)((long)&cursor->stack[0].index + 4) = 0xffffffff;
  *(undefined4 *)&cursor->stack[0].bit_offset = 0xffffffff;
  *(undefined4 *)((long)&cursor->stack[0].bit_offset + 4) = 0xffffffff;
  return 0;
}

Assistant:

int coda_netcdf_cursor_set_product(coda_cursor *cursor, coda_product *product)
{
    cursor->product = product;
    cursor->n = 1;
    cursor->stack[0].type = product->root_type;
    cursor->stack[0].index = -1;        /* there is no index for the root of the product */
    cursor->stack[0].bit_offset = -1;   /* not applicable for netCDF backend */

    return 0;
}